

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImBezierCubicClosestPointCasteljauStep
               (ImVec2 *p,ImVec2 *p_closest,ImVec2 *p_last,float *p_closest_dist2,float x1,float y1,
               float x2,float y2,float x3,float y3,float x4,float y4,float tess_tol,int level)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  
  while( true ) {
    fVar5 = x4 - x1;
    fVar7 = y4 - y1;
    fVar12 = fVar7 * (x2 - x4) - fVar5 * (y2 - y4);
    fVar13 = fVar7 * (x3 - x4) - fVar5 * (y3 - y4);
    uVar3 = -(uint)(-fVar12 <= fVar12);
    uVar4 = -(uint)(-fVar13 <= fVar13);
    fVar12 = (float)(~uVar4 & (uint)-fVar13 | (uint)fVar13 & uVar4) +
             (float)(~uVar3 & (uint)-fVar12 | (uint)fVar12 & uVar3);
    if (fVar12 * fVar12 < (fVar5 * fVar5 + fVar7 * fVar7) * tess_tol) {
      fVar5 = (*p_last).x;
      fVar7 = (*p_last).y;
      fVar13 = x4 - fVar5;
      fVar8 = y4 - fVar7;
      fVar12 = (p->x - fVar5) * fVar13 + (p->y - fVar7) * fVar8;
      if (0.0 <= fVar12) {
        fVar9 = fVar13 * fVar13 + fVar8 * fVar8;
        fVar14 = x4;
        fVar6 = y4;
        if (fVar12 <= fVar9) {
          auVar10._0_4_ = fVar13 * fVar12;
          auVar10._4_4_ = fVar8 * fVar12;
          auVar10._8_4_ = (in_XMM6_Dc - 0.0) * fVar12;
          auVar10._12_4_ = (in_XMM6_Dd - 0.0) * fVar12;
          auVar11._4_4_ = fVar9;
          auVar11._0_4_ = fVar9;
          auVar11._8_4_ = fVar9;
          auVar11._12_4_ = fVar9;
          auVar11 = divps(auVar10,auVar11);
          fVar14 = fVar5 + auVar11._0_4_;
          fVar6 = fVar7 + auVar11._4_4_;
        }
      }
      else {
        fVar14 = (*p_last).x;
        fVar6 = (*p_last).y;
      }
      fVar5 = p->x - fVar14;
      fVar7 = p->y - fVar6;
      fVar5 = fVar5 * fVar5 + fVar7 * fVar7;
      if (fVar5 < *p_closest_dist2) {
        IVar1.y = fVar6;
        IVar1.x = fVar14;
        *p_closest = IVar1;
        *p_closest_dist2 = fVar5;
      }
      IVar2.y = y4;
      IVar2.x = x4;
      *p_last = IVar2;
      return;
    }
    if (9 < level) break;
    fVar5 = (x1 + x2) * 0.5;
    fVar7 = (x3 + x2) * 0.5;
    fVar12 = (y1 + y2) * 0.5;
    fVar13 = (y3 + y2) * 0.5;
    x3 = (x3 + x4) * 0.5;
    y3 = (y3 + y4) * 0.5;
    fVar8 = (fVar5 + fVar7) * 0.5;
    x2 = (x3 + fVar7) * 0.5;
    fVar7 = (fVar12 + fVar13) * 0.5;
    y2 = (y3 + fVar13) * 0.5;
    fVar13 = (x2 + fVar8) * 0.5;
    fVar14 = (y2 + fVar7) * 0.5;
    level = level + 1;
    ImBezierCubicClosestPointCasteljauStep
              (p,p_closest,p_last,p_closest_dist2,x1,y1,fVar5,fVar12,fVar8,fVar7,fVar13,fVar14,
               tess_tol,level);
    x1 = fVar13;
    y1 = fVar14;
  }
  return;
}

Assistant:

static void ImBezierCubicClosestPointCasteljauStep(const ImVec2& p, ImVec2& p_closest, ImVec2& p_last, float& p_closest_dist2, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        ImVec2 p_current(x4, y4);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2)*0.5f,       y12 = (y1 + y2)*0.5f;
        float x23 = (x2 + x3)*0.5f,       y23 = (y2 + y3)*0.5f;
        float x34 = (x3 + x4)*0.5f,       y34 = (y3 + y4)*0.5f;
        float x123 = (x12 + x23)*0.5f,    y123 = (y12 + y23)*0.5f;
        float x234 = (x23 + x34)*0.5f,    y234 = (y23 + y34)*0.5f;
        float x1234 = (x123 + x234)*0.5f, y1234 = (y123 + y234)*0.5f;
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}